

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parquet_types.cpp
# Opt level: O3

ssize_t __thiscall
duckdb_parquet::ColumnIndex::read(ColumnIndex *this,int __fd,void *__buf,size_t __nbytes)

{
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
  *this_00;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
  *this_01;
  pointer plVar1;
  vector<bool,_true> *this_02;
  vector<long,_true> *pvVar2;
  int iVar3;
  int iVar4;
  int iVar5;
  undefined4 extraout_var;
  reference pvVar6;
  undefined4 extraout_var_00;
  undefined4 extraout_var_01;
  reference pvVar7;
  undefined8 *puVar8;
  undefined4 in_register_00000034;
  TProtocol *this_03;
  size_type __n;
  size_type sVar9;
  size_type sVar10;
  reference rVar11;
  uint32_t _size174;
  TType _etype177;
  int16_t fid;
  string fname;
  TType ftype;
  type local_b0;
  undefined1 local_ac [4];
  ColumnIndex *local_a8;
  ushort local_9a;
  undefined1 *local_98;
  undefined8 local_90;
  undefined1 local_88 [20];
  int local_74;
  undefined8 local_70;
  undefined8 local_68;
  undefined8 local_60;
  undefined8 local_58;
  vector<bool,_true> *local_50;
  vector<long,_true> *local_48;
  vector<long,_true> *local_40;
  vector<long,_true> *local_38;
  
  this_03 = (TProtocol *)CONCAT44(in_register_00000034,__fd);
  duckdb_apache::thrift::protocol::TProtocol::incrementInputRecursionDepth(this_03);
  local_98 = local_88;
  local_90 = 0;
  local_88[0] = 0;
  iVar3 = (*this_03->_vptr_TProtocol[0x19])(this_03,&local_98);
  local_38 = &this->definition_level_histograms;
  local_40 = &this->repetition_level_histograms;
  local_48 = &this->null_counts;
  this_00 = &this->max_values;
  this_01 = &this->min_values;
  local_50 = &this->null_pages;
  local_60 = 0;
  local_70 = 0;
  local_68 = 0;
  local_58 = 0;
  local_a8 = this;
  do {
    iVar4 = (*this_03->_vptr_TProtocol[0x1b])(this_03,&local_98,&local_74,&local_9a);
    iVar4 = iVar4 + iVar3;
    if (local_74 == 0) {
      iVar3 = (*this_03->_vptr_TProtocol[0x1a])(this_03);
      if (((byte)local_68 & (byte)local_58 & (byte)local_60 & (byte)local_70 & 1) == 0) {
        puVar8 = (undefined8 *)__cxa_allocate_exception(0x30);
        puVar8[1] = puVar8 + 3;
        puVar8[2] = 0;
        *(undefined1 *)(puVar8 + 3) = 0;
        *puVar8 = &PTR__TException_0247b320;
        *(undefined4 *)(puVar8 + 5) = 1;
        __cxa_throw(puVar8,&duckdb_apache::thrift::protocol::TProtocolException::typeinfo,
                    duckdb_apache::thrift::TException::~TException);
      }
      if (local_98 != local_88) {
        operator_delete(local_98);
      }
      this_03->input_recursion_depth_ = this_03->input_recursion_depth_ - 1;
      return (ulong)(uint)(iVar3 + iVar4);
    }
    switch(local_9a) {
    case 1:
      if (local_74 != 0xf) {
        iVar5 = (*this_03->_vptr_TProtocol[0x2c])(this_03);
        break;
      }
      (local_a8->null_pages).super_vector<bool,_std::allocator<bool>_>.
      super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data._M_finish.
      super__Bit_iterator_base._M_p =
           (local_a8->null_pages).super_vector<bool,_std::allocator<bool>_>.
           super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data._M_start.
           super__Bit_iterator_base._M_p;
      (local_a8->null_pages).super_vector<bool,_std::allocator<bool>_>.
      super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data._M_finish.
      super__Bit_iterator_base._M_offset = 0;
      iVar5 = (*this_03->_vptr_TProtocol[0x1f])(this_03,local_ac,&local_b0);
      this_02 = local_50;
      std::vector<bool,_std::allocator<bool>_>::resize
                (&local_50->super_vector<bool,_std::allocator<bool>_>,(ulong)local_b0,false);
      iVar5 = iVar5 + iVar4;
      if (local_b0 != UNORDERED) {
        __n = 0;
        do {
          rVar11 = duckdb::vector<bool,_true>::get<true>(this_02,__n);
          iVar3 = (*this_03->_vptr_TProtocol[0x24])(this_03,rVar11._M_p,rVar11._M_mask);
          iVar5 = iVar5 + iVar3;
          __n = __n + 1;
        } while (__n < local_b0);
      }
      iVar3 = (*this_03->_vptr_TProtocol[0x20])(this_03);
      iVar5 = iVar3 + iVar5;
      local_60 = CONCAT71((int7)(CONCAT44(extraout_var,iVar3) >> 8),1);
      goto LAB_01ca80f3;
    case 2:
      if (local_74 == 0xf) {
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::clear((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)this_01);
        iVar5 = (*this_03->_vptr_TProtocol[0x1f])(this_03,local_ac,&local_b0);
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::resize((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  *)this_01,(ulong)local_b0);
        iVar5 = iVar5 + iVar4;
        if (local_b0 != UNORDERED) {
          sVar9 = 0;
          do {
            pvVar6 = duckdb::
                     vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
                     ::operator[](this_01,sVar9);
            iVar3 = (*this_03->_vptr_TProtocol[0x2b])(this_03,pvVar6);
            iVar5 = iVar5 + iVar3;
            sVar9 = sVar9 + 1;
          } while (sVar9 < local_b0);
        }
        iVar3 = (*this_03->_vptr_TProtocol[0x20])(this_03);
        iVar5 = iVar3 + iVar5;
        local_70 = CONCAT71((int7)(CONCAT44(extraout_var_01,iVar3) >> 8),1);
        goto LAB_01ca80f3;
      }
      iVar5 = (*this_03->_vptr_TProtocol[0x2c])(this_03);
      break;
    case 3:
      if (local_74 == 0xf) {
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::clear((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)this_00);
        iVar5 = (*this_03->_vptr_TProtocol[0x1f])(this_03,local_ac,&local_b0);
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::resize((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  *)this_00,(ulong)local_b0);
        iVar5 = iVar5 + iVar4;
        if (local_b0 != UNORDERED) {
          sVar9 = 0;
          do {
            pvVar6 = duckdb::
                     vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
                     ::operator[](this_00,sVar9);
            iVar3 = (*this_03->_vptr_TProtocol[0x2b])(this_03,pvVar6);
            iVar5 = iVar5 + iVar3;
            sVar9 = sVar9 + 1;
          } while (sVar9 < local_b0);
        }
        iVar3 = (*this_03->_vptr_TProtocol[0x20])(this_03);
        iVar5 = iVar3 + iVar5;
        local_68 = CONCAT71((int7)(CONCAT44(extraout_var_00,iVar3) >> 8),1);
        goto LAB_01ca80f3;
      }
      iVar5 = (*this_03->_vptr_TProtocol[0x2c])(this_03);
      break;
    case 4:
      if (local_74 == 8) {
        iVar5 = (*this_03->_vptr_TProtocol[0x27])(this_03,&local_b0);
        iVar5 = iVar5 + iVar4;
        local_a8->boundary_order = local_b0;
        local_58 = CONCAT71((uint7)(uint3)(local_b0 >> 8),1);
        goto LAB_01ca80f3;
      }
      iVar5 = (*this_03->_vptr_TProtocol[0x2c])(this_03);
      break;
    case 5:
      if (local_74 == 0xf) {
        plVar1 = (local_a8->null_counts).super_vector<long,_std::allocator<long>_>.
                 super__Vector_base<long,_std::allocator<long>_>._M_impl.super__Vector_impl_data.
                 _M_start;
        if ((local_a8->null_counts).super_vector<long,_std::allocator<long>_>.
            super__Vector_base<long,_std::allocator<long>_>._M_impl.super__Vector_impl_data.
            _M_finish != plVar1) {
          (local_a8->null_counts).super_vector<long,_std::allocator<long>_>.
          super__Vector_base<long,_std::allocator<long>_>._M_impl.super__Vector_impl_data._M_finish
               = plVar1;
        }
        iVar3 = (*this_03->_vptr_TProtocol[0x1f])(this_03,local_ac,&local_b0);
        pvVar2 = local_48;
        std::vector<long,_std::allocator<long>_>::resize
                  (&local_48->super_vector<long,_std::allocator<long>_>,(ulong)local_b0);
        iVar3 = iVar3 + iVar4;
        if (local_b0 != UNORDERED) {
          sVar10 = 0;
          do {
            pvVar7 = duckdb::vector<long,_true>::operator[](pvVar2,sVar10);
            iVar4 = (*this_03->_vptr_TProtocol[0x28])(this_03,pvVar7);
            iVar3 = iVar3 + iVar4;
            sVar10 = sVar10 + 1;
          } while (sVar10 < local_b0);
        }
        iVar5 = (*this_03->_vptr_TProtocol[0x20])(this_03);
        iVar5 = iVar5 + iVar3;
        local_a8->__isset = (_ColumnIndex__isset)((byte)local_a8->__isset | 1);
        goto LAB_01ca80f3;
      }
      iVar5 = (*this_03->_vptr_TProtocol[0x2c])(this_03);
      break;
    case 6:
      if (local_74 == 0xf) {
        plVar1 = (local_a8->repetition_level_histograms).super_vector<long,_std::allocator<long>_>.
                 super__Vector_base<long,_std::allocator<long>_>._M_impl.super__Vector_impl_data.
                 _M_start;
        if ((local_a8->repetition_level_histograms).super_vector<long,_std::allocator<long>_>.
            super__Vector_base<long,_std::allocator<long>_>._M_impl.super__Vector_impl_data.
            _M_finish != plVar1) {
          (local_a8->repetition_level_histograms).super_vector<long,_std::allocator<long>_>.
          super__Vector_base<long,_std::allocator<long>_>._M_impl.super__Vector_impl_data._M_finish
               = plVar1;
        }
        iVar3 = (*this_03->_vptr_TProtocol[0x1f])(this_03,local_ac,&local_b0);
        pvVar2 = local_40;
        std::vector<long,_std::allocator<long>_>::resize
                  (&local_40->super_vector<long,_std::allocator<long>_>,(ulong)local_b0);
        iVar3 = iVar3 + iVar4;
        if (local_b0 != UNORDERED) {
          sVar10 = 0;
          do {
            pvVar7 = duckdb::vector<long,_true>::operator[](pvVar2,sVar10);
            iVar4 = (*this_03->_vptr_TProtocol[0x28])(this_03,pvVar7);
            iVar3 = iVar3 + iVar4;
            sVar10 = sVar10 + 1;
          } while (sVar10 < local_b0);
        }
        iVar5 = (*this_03->_vptr_TProtocol[0x20])(this_03);
        iVar5 = iVar5 + iVar3;
        local_a8->__isset = (_ColumnIndex__isset)((byte)local_a8->__isset | 2);
        goto LAB_01ca80f3;
      }
      iVar5 = (*this_03->_vptr_TProtocol[0x2c])(this_03);
      break;
    case 7:
      if (local_74 == 0xf) {
        plVar1 = (local_a8->definition_level_histograms).super_vector<long,_std::allocator<long>_>.
                 super__Vector_base<long,_std::allocator<long>_>._M_impl.super__Vector_impl_data.
                 _M_start;
        if ((local_a8->definition_level_histograms).super_vector<long,_std::allocator<long>_>.
            super__Vector_base<long,_std::allocator<long>_>._M_impl.super__Vector_impl_data.
            _M_finish != plVar1) {
          (local_a8->definition_level_histograms).super_vector<long,_std::allocator<long>_>.
          super__Vector_base<long,_std::allocator<long>_>._M_impl.super__Vector_impl_data._M_finish
               = plVar1;
        }
        iVar3 = (*this_03->_vptr_TProtocol[0x1f])(this_03,local_ac,&local_b0);
        pvVar2 = local_38;
        std::vector<long,_std::allocator<long>_>::resize
                  (&local_38->super_vector<long,_std::allocator<long>_>,(ulong)local_b0);
        iVar3 = iVar3 + iVar4;
        if (local_b0 != UNORDERED) {
          sVar10 = 0;
          do {
            pvVar7 = duckdb::vector<long,_true>::operator[](pvVar2,sVar10);
            iVar4 = (*this_03->_vptr_TProtocol[0x28])(this_03,pvVar7);
            iVar3 = iVar3 + iVar4;
            sVar10 = sVar10 + 1;
          } while (sVar10 < local_b0);
        }
        iVar5 = (*this_03->_vptr_TProtocol[0x20])(this_03);
        iVar5 = iVar5 + iVar3;
        local_a8->__isset = (_ColumnIndex__isset)((byte)local_a8->__isset | 4);
        goto LAB_01ca80f3;
      }
      iVar5 = (*this_03->_vptr_TProtocol[0x2c])(this_03);
      break;
    default:
      iVar5 = (*this_03->_vptr_TProtocol[0x2c])(this_03);
    }
    iVar5 = iVar5 + iVar4;
LAB_01ca80f3:
    iVar3 = (*this_03->_vptr_TProtocol[0x1c])(this_03);
    iVar3 = iVar3 + iVar5;
  } while( true );
}

Assistant:

uint32_t ColumnIndex::read(::apache::thrift::protocol::TProtocol* iprot) {

  ::apache::thrift::protocol::TInputRecursionTracker tracker(*iprot);
  uint32_t xfer = 0;
  std::string fname;
  ::apache::thrift::protocol::TType ftype;
  int16_t fid;

  xfer += iprot->readStructBegin(fname);

  using ::apache::thrift::protocol::TProtocolException;

  bool isset_null_pages = false;
  bool isset_min_values = false;
  bool isset_max_values = false;
  bool isset_boundary_order = false;

  while (true)
  {
    xfer += iprot->readFieldBegin(fname, ftype, fid);
    if (ftype == ::apache::thrift::protocol::T_STOP) {
      break;
    }
    switch (fid)
    {
      case 1:
        if (ftype == ::apache::thrift::protocol::T_LIST) {
          {
            this->null_pages.clear();
            uint32_t _size174;
            ::apache::thrift::protocol::TType _etype177;
            xfer += iprot->readListBegin(_etype177, _size174);
            this->null_pages.resize(_size174);
            uint32_t _i178;
            for (_i178 = 0; _i178 < _size174; ++_i178)
            {
              xfer += iprot->readBool(this->null_pages[_i178]);
            }
            xfer += iprot->readListEnd();
          }
          isset_null_pages = true;
        } else {
          xfer += iprot->skip(ftype);
        }
        break;
      case 2:
        if (ftype == ::apache::thrift::protocol::T_LIST) {
          {
            this->min_values.clear();
            uint32_t _size179;
            ::apache::thrift::protocol::TType _etype182;
            xfer += iprot->readListBegin(_etype182, _size179);
            this->min_values.resize(_size179);
            uint32_t _i183;
            for (_i183 = 0; _i183 < _size179; ++_i183)
            {
              xfer += iprot->readBinary(this->min_values[_i183]);
            }
            xfer += iprot->readListEnd();
          }
          isset_min_values = true;
        } else {
          xfer += iprot->skip(ftype);
        }
        break;
      case 3:
        if (ftype == ::apache::thrift::protocol::T_LIST) {
          {
            this->max_values.clear();
            uint32_t _size184;
            ::apache::thrift::protocol::TType _etype187;
            xfer += iprot->readListBegin(_etype187, _size184);
            this->max_values.resize(_size184);
            uint32_t _i188;
            for (_i188 = 0; _i188 < _size184; ++_i188)
            {
              xfer += iprot->readBinary(this->max_values[_i188]);
            }
            xfer += iprot->readListEnd();
          }
          isset_max_values = true;
        } else {
          xfer += iprot->skip(ftype);
        }
        break;
      case 4:
        if (ftype == ::apache::thrift::protocol::T_I32) {
          int32_t ecast189;
          xfer += iprot->readI32(ecast189);
          this->boundary_order = static_cast<BoundaryOrder::type>(ecast189);
          isset_boundary_order = true;
        } else {
          xfer += iprot->skip(ftype);
        }
        break;
      case 5:
        if (ftype == ::apache::thrift::protocol::T_LIST) {
          {
            this->null_counts.clear();
            uint32_t _size190;
            ::apache::thrift::protocol::TType _etype193;
            xfer += iprot->readListBegin(_etype193, _size190);
            this->null_counts.resize(_size190);
            uint32_t _i194;
            for (_i194 = 0; _i194 < _size190; ++_i194)
            {
              xfer += iprot->readI64(this->null_counts[_i194]);
            }
            xfer += iprot->readListEnd();
          }
          this->__isset.null_counts = true;
        } else {
          xfer += iprot->skip(ftype);
        }
        break;
      case 6:
        if (ftype == ::apache::thrift::protocol::T_LIST) {
          {
            this->repetition_level_histograms.clear();
            uint32_t _size195;
            ::apache::thrift::protocol::TType _etype198;
            xfer += iprot->readListBegin(_etype198, _size195);
            this->repetition_level_histograms.resize(_size195);
            uint32_t _i199;
            for (_i199 = 0; _i199 < _size195; ++_i199)
            {
              xfer += iprot->readI64(this->repetition_level_histograms[_i199]);
            }
            xfer += iprot->readListEnd();
          }
          this->__isset.repetition_level_histograms = true;
        } else {
          xfer += iprot->skip(ftype);
        }
        break;
      case 7:
        if (ftype == ::apache::thrift::protocol::T_LIST) {
          {
            this->definition_level_histograms.clear();
            uint32_t _size200;
            ::apache::thrift::protocol::TType _etype203;
            xfer += iprot->readListBegin(_etype203, _size200);
            this->definition_level_histograms.resize(_size200);
            uint32_t _i204;
            for (_i204 = 0; _i204 < _size200; ++_i204)
            {
              xfer += iprot->readI64(this->definition_level_histograms[_i204]);
            }
            xfer += iprot->readListEnd();
          }
          this->__isset.definition_level_histograms = true;
        } else {
          xfer += iprot->skip(ftype);
        }
        break;
      default:
        xfer += iprot->skip(ftype);
        break;
    }
    xfer += iprot->readFieldEnd();
  }

  xfer += iprot->readStructEnd();

  if (!isset_null_pages)
    throw TProtocolException(TProtocolException::INVALID_DATA);
  if (!isset_min_values)
    throw TProtocolException(TProtocolException::INVALID_DATA);
  if (!isset_max_values)
    throw TProtocolException(TProtocolException::INVALID_DATA);
  if (!isset_boundary_order)
    throw TProtocolException(TProtocolException::INVALID_DATA);
  return xfer;
}